

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

IGUISpriteBank * __thiscall
irr::gui::CGUIEnvironment::getSpriteBank(CGUIEnvironment *this,path *filename)

{
  array<irr::gui::CGUIEnvironment::SSpriteBank> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  IGUISpriteBank *pIVar6;
  double __x;
  SSpriteBank b;
  SSpriteBank local_78;
  
  paVar1 = &local_78.NamedPath.Path.str.field_2;
  local_78.NamedPath.Path.str._M_string_length = 0;
  local_78.NamedPath.Path.str.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_78.NamedPath.InternalName.str.field_2;
  local_78.NamedPath.InternalName.str._M_string_length = 0;
  local_78.NamedPath.InternalName.str.field_2._M_local_buf[0] = '\0';
  local_78.NamedPath.Path.str._M_dataplus._M_p = (pointer)paVar1;
  local_78.NamedPath.InternalName.str._M_dataplus._M_p = (pointer)paVar2;
  irr::io::SNamedPath::setPath(&local_78.NamedPath,filename);
  this_00 = &this->Banks;
  core::array<irr::gui::CGUIEnvironment::SSpriteBank>::sort(this_00);
  uVar4 = core::array<irr::gui::CGUIEnvironment::SSpriteBank>::binary_search
                    (this_00,&local_78,0,
                     (int)((ulong)((long)(this->Banks).m_data.
                                         super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->Banks).m_data.
                                        super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     0x38e38e39 + -1);
  if (uVar4 == 0xffffffff) {
    iVar5 = (*this->FileSystem->_vptr_IFileSystem[0x1b])(this->FileSystem,&local_78);
    if ((char)iVar5 == '\0') {
      bVar3 = core::string<char>::operator==(filename,(string<char> *)&DefaultFontName);
      if (!bVar3) {
        pIVar6 = (IGUISpriteBank *)0x0;
        os::Printer::log(__x);
        goto LAB_0021b0fc;
      }
    }
    pIVar6 = (IGUISpriteBank *)0x0;
  }
  else {
    pIVar6 = (this_00->m_data).
             super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4].Bank;
  }
LAB_0021b0fc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.NamedPath.InternalName.str._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.NamedPath.InternalName.str._M_dataplus._M_p,
                    CONCAT71(local_78.NamedPath.InternalName.str.field_2._M_allocated_capacity._1_7_
                             ,local_78.NamedPath.InternalName.str.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.NamedPath.Path.str._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.NamedPath.Path.str._M_dataplus._M_p,
                    CONCAT71(local_78.NamedPath.Path.str.field_2._M_allocated_capacity._1_7_,
                             local_78.NamedPath.Path.str.field_2._M_local_buf[0]) + 1);
  }
  return pIVar6;
}

Assistant:

IGUISpriteBank *CGUIEnvironment::getSpriteBank(const io::path &filename)
{
	// search for the file name

	SSpriteBank b;
	b.NamedPath.setPath(filename);

	s32 index = Banks.binary_search(b);
	if (index != -1)
		return Banks[index].Bank;

	// we don't have this sprite bank, we should load it
	if (!FileSystem->existFile(b.NamedPath.getPath())) {
		if (filename != DefaultFontName) {
			os::Printer::log("Could not load sprite bank because the file does not exist", b.NamedPath.getPath(), ELL_DEBUG);
		}
		return 0;
	}

	// todo: load it!

	return 0;
}